

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatSolver.c
# Opt level: O2

uint xSAT_SolverPropagate(xSAT_Solver_t *s)

{
  uint *puVar1;
  iword *piVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  char cVar6;
  uint uVar7;
  xSAT_WatchList_t *pxVar8;
  xSAT_WatchList_t *v;
  uint uVar9;
  int iVar10;
  xSAT_Watcher_t *pxVar11;
  xSAT_Watcher_t e;
  xSAT_Watcher_t *pxVar12;
  ulong uVar13;
  xSAT_Watcher_t *pxVar14;
  uint *puVar15;
  xSAT_Watcher_t *pxVar16;
  uint *puVar17;
  uint local_64;
  
  local_64 = 0xffffffff;
  uVar9 = 0;
  do {
    iVar10 = s->iQhead;
    if (s->vTrail->nSize <= iVar10) {
      piVar2 = &(s->Stats).nPropagations;
      *piVar2 = *piVar2 + (ulong)uVar9;
      s->nPropSimplify = s->nPropSimplify - (ulong)uVar9;
      return local_64;
    }
    s->iQhead = iVar10 + 1;
    uVar7 = Vec_IntEntry(s->vTrail,iVar10);
    pxVar8 = xSAT_VecWatchListEntry(s->vBinWatches,uVar7);
    pxVar11 = pxVar8->pArray;
    pxVar14 = pxVar11 + pxVar8->nSize;
    uVar9 = uVar9 + 1;
    for (; pxVar11 < pxVar14; pxVar11 = pxVar11 + 1) {
      cVar6 = Vec_StrEntry(s->vAssigns,pxVar11->Blocker >> 1);
      if (cVar6 == '\x03') {
        xSAT_SolverEnqueue(s,pxVar11->Blocker,pxVar11->CRef);
      }
      else {
        cVar6 = Vec_StrEntry(s->vAssigns,pxVar11->Blocker >> 1);
        if ((pxVar11->Blocker & 1U ^ (int)cVar6) == 1) {
          return pxVar11->CRef;
        }
      }
    }
    pxVar8 = xSAT_VecWatchListEntry(s->vWatches,uVar7);
    pxVar14 = pxVar8->pArray;
    pxVar16 = pxVar14 + pxVar8->nSize;
    uVar7 = uVar7 ^ 1;
    pxVar11 = pxVar14;
    for (; pxVar14 < pxVar16; pxVar14 = pxVar14 + 1) {
      cVar6 = Vec_StrEntry(s->vAssigns,pxVar14->Blocker >> 1);
      if ((pxVar14->Blocker & 1U) == (int)cVar6) {
        *pxVar11 = *pxVar14;
        pxVar12 = pxVar11 + 1;
      }
      else {
        if ((long)(int)pxVar14->CRef == -1) {
          puVar15 = (uint *)0x0;
        }
        else {
          puVar15 = s->pMemory->pData + (int)pxVar14->CRef;
        }
        uVar3 = puVar15[2];
        uVar4 = puVar15[3];
        if (uVar3 == uVar7) {
          puVar15[2] = uVar4;
          puVar15[3] = uVar7;
          uVar3 = uVar4;
        }
        else if (uVar4 != uVar7) {
          __assert_fail("Lits[1] == NegLit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/xsat/xsatSolver.c"
                        ,0x2c9,"unsigned int xSAT_SolverPropagate(xSAT_Solver_t *)");
        }
        puVar1 = puVar15 + 2;
        uVar4 = pxVar14->CRef;
        if ((uVar3 == pxVar14->Blocker) ||
           (cVar6 = Vec_StrEntry(s->vAssigns,(int)uVar3 >> 1), (*puVar1 & 1) != (int)cVar6)) {
          uVar5 = puVar15[1];
          for (puVar17 = puVar15 + 4; puVar17 < puVar1 + (int)uVar5; puVar17 = puVar17 + 1) {
            cVar6 = Vec_StrEntry(s->vAssigns,(int)*puVar17 >> 1);
            if ((*puVar17 & 1 ^ (int)cVar6) != 1) {
              puVar15[3] = *puVar17;
              *puVar17 = uVar7;
              v = xSAT_VecWatchListEntry(s->vWatches,puVar15[3] ^ 1);
              e.Blocker = uVar3;
              e.CRef = uVar4;
              xSAT_WatchListPush(v,e);
              pxVar12 = pxVar11;
              goto LAB_0071cca8;
            }
          }
          pxVar12 = pxVar11 + 1;
          pxVar11->CRef = uVar4;
          pxVar11->Blocker = uVar3;
          cVar6 = Vec_StrEntry(s->vAssigns,(int)*puVar1 >> 1);
          uVar4 = pxVar14->CRef;
          if ((*puVar1 & 1 ^ (int)cVar6) == 1) {
            s->iQhead = s->vTrail->nSize;
            while (pxVar14 = pxVar14 + 1, local_64 = uVar4, pxVar14 < pxVar16) {
              *pxVar12 = *pxVar14;
              pxVar12 = pxVar12 + 1;
            }
          }
          else {
            xSAT_SolverEnqueue(s,*puVar1,uVar4);
          }
        }
        else {
          pxVar11->CRef = uVar4;
          pxVar11->Blocker = uVar3;
          pxVar12 = pxVar11 + 1;
        }
      }
LAB_0071cca8:
      pxVar11 = pxVar12;
    }
    uVar13 = (long)pxVar11 - (long)pxVar8->pArray;
    piVar2 = &(s->Stats).nInspects;
    *piVar2 = *piVar2 + ((long)uVar13 >> 3);
    iVar10 = (int)(uVar13 >> 3);
    if (pxVar8->nSize < iVar10) {
      __assert_fail("k <= v->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/xsat/xsatWatchList.h"
                    ,0x67,"void xSAT_WatchListShrink(xSAT_WatchList_t *, int)");
    }
    pxVar8->nSize = iVar10;
  } while( true );
}

Assistant:

unsigned xSAT_SolverPropagate( xSAT_Solver_t* s )
{
    unsigned hConfl = CRefUndef;
    int * Lits;
    int NegLit;
    int nProp = 0;

    while ( s->iQhead < Vec_IntSize( s->vTrail ) )
    {
        int p = Vec_IntEntry( s->vTrail, s->iQhead++ );
        xSAT_WatchList_t* ws = xSAT_VecWatchListEntry( s->vBinWatches, p );
        xSAT_Watcher_t* begin = xSAT_WatchListArray( ws );
        xSAT_Watcher_t* end   = begin + xSAT_WatchListSize( ws );
        xSAT_Watcher_t *i, *j;

        nProp++;
        for ( i = begin; i < end; i++ )
        {
            if ( Vec_StrEntry( s->vAssigns, xSAT_Lit2Var( i->Blocker ) ) == VarX )
                xSAT_SolverEnqueue( s, i->Blocker, i->CRef );
            else if ( Vec_StrEntry( s->vAssigns, xSAT_Lit2Var( i->Blocker ) ) == xSAT_LitSign( xSAT_NegLit( i->Blocker ) ) )
                return i->CRef;
        }

        ws    = xSAT_VecWatchListEntry( s->vWatches, p );
        begin = xSAT_WatchListArray( ws );
        end   = begin + xSAT_WatchListSize( ws );

        for ( i = j = begin; i < end; )
        {
            xSAT_Clause_t * pCla;
            xSAT_Watcher_t w;
            if ( Vec_StrEntry( s->vAssigns, xSAT_Lit2Var( i->Blocker ) ) == xSAT_LitSign( i->Blocker ) )
            {
                *j++ = *i++;
                continue;
            }

            pCla = xSAT_SolverReadClause( s, i->CRef );
            Lits = &( pCla->pData[0].Lit );

            // Make sure the false literal is data[1]:
            NegLit = xSAT_NegLit( p );
            if ( Lits[0] == NegLit )
            {
                Lits[0] = Lits[1];
                Lits[1] = NegLit;
            }
            assert( Lits[1] == NegLit );

            w.CRef = i->CRef;
            w.Blocker = Lits[0];

            // If 0th watch is true, then clause is already satisfied.
            if ( Lits[0] != i->Blocker && Vec_StrEntry( s->vAssigns, xSAT_Lit2Var( Lits[0] ) ) == xSAT_LitSign( Lits[0] ) )
                *j++ = w;
            else
            {
                // Look for new watch:
                int * stop = Lits + pCla->nSize;
                int * k;
                for ( k = Lits + 2; k < stop; k++ )
                {
                    if (Vec_StrEntry( s->vAssigns, xSAT_Lit2Var( *k ) ) != !xSAT_LitSign( *k ) )
                    {
                        Lits[1] = *k;
                        *k = NegLit;
                        xSAT_WatchListPush( xSAT_VecWatchListEntry( s->vWatches, xSAT_NegLit( Lits[1] ) ), w );
                        goto next;
                    }
                }

                *j++ = w;

                // Clause is unit under assignment:
                if (Vec_StrEntry( s->vAssigns, xSAT_Lit2Var( Lits[0] ) ) == xSAT_LitSign( xSAT_NegLit( Lits[0] ) ) )
                {
                    hConfl = i->CRef;
                    i++;
                    s->iQhead = Vec_IntSize( s->vTrail );
                    // Copy the remaining watches:
                    while (i < end)
                        *j++ = *i++;
                }
                else
                    xSAT_SolverEnqueue( s, Lits[0], i->CRef );
            }
        next:
            i++;
        }

        s->Stats.nInspects += j - xSAT_WatchListArray( ws );
        xSAT_WatchListShrink( ws, j - xSAT_WatchListArray( ws ) );
    }

    s->Stats.nPropagations += nProp;
    s->nPropSimplify -= nProp;

    return hConfl;
}